

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O1

double TestSpectra::DD_spectrum
                 (double xMin,double xMax,double expFall,double peakFrac,double peakMu,
                 double peakSig,double peakSkew)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  pointer pdVar3;
  RandomGen *pRVar4;
  double dVar5;
  ulong in_XMM3_Qb;
  ulong in_XMM4_Qb;
  undefined1 auVar6 [16];
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> xyTry;
  allocator_type local_b1;
  double local_b0;
  double local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  double local_88;
  double local_80;
  vector<double,_std::allocator<double>_> local_78;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  undefined1 local_28 [16];
  
  local_58 = 80.0;
  if (xMax <= 80.0) {
    local_58 = xMax;
  }
  local_88 = 0.0;
  if (0.0 <= xMin) {
    local_88 = xMin;
  }
  auVar6._0_8_ = ~-(ulong)(peakMu < local_58) & 0x3ff0000000000000;
  auVar6._8_8_ = 0;
  auVar1._8_4_ = (int)(in_XMM3_Qb & in_XMM4_Qb);
  auVar1._0_8_ = (ulong)(peakFrac + 1.0) & -(ulong)(peakMu < local_58);
  auVar1._12_4_ = (int)((in_XMM3_Qb & in_XMM4_Qb) >> 0x20);
  local_28 = auVar6 | auVar1;
  local_a8 = local_58 - local_88;
  local_b0 = peakSig;
  local_80 = peakMu;
  local_50 = peakFrac;
  local_48 = expFall;
  local_40 = peakSkew;
  pRVar4 = RandomGen::rndm();
  dVar5 = RandomGen::rand_uniform(pRVar4);
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(dVar5 * local_a8 + local_88);
  pRVar4 = RandomGen::rndm();
  dVar5 = RandomGen::rand_uniform(pRVar4);
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(dVar5 * (double)local_28._0_8_ + 0.0);
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector(&local_a0,__l,&local_b1);
  if (0.0 < local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[2]) {
    do {
      local_a8 = exp(-*local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start / local_48);
      dVar5 = (*local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start - local_80) / local_b0;
      local_38 = exp(-dVar5 * dVar5);
      local_30 = erf(((*local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start - local_80) * local_40) / local_b0);
      pRVar4 = RandomGen::rndm();
      RandomGen::VonNeumann
                (&local_78,pRVar4,local_88,local_58,0.0,(double)local_28._0_8_,
                 *local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1],
                 (local_30 + 1.0) * local_38 * local_50 + local_a8);
      pdVar3 = local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar2 = local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pdVar2 != (double *)0x0) {
        operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
      }
      if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    } while (0.0 < local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[2]);
  }
  local_b0 = *local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  operator_delete(local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return local_b0;
}

Assistant:

double TestSpectra::DD_spectrum(double xMin, double xMax, double expFall,
                                double peakFrac, double peakMu,
                                double peakSig, double peakSkew) {
  // JV LUX, most closely like JENDL-4. See arXiv:1608.05381. Lower than
  // G4/LUXSim
  if (xMax > 80.) xMax = 80.;
  if (xMin < 0.000) xMin = 0.000;
  double yMin = 0.0;
  double yMax = 1.; if ( peakMu < xMax ) yMax += peakFrac;
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMin + (yMax - yMin) * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double FuncValue = exp(-xyTry[0] / expFall) +
                       peakFrac * exp(-pow((xyTry[0] - peakMu) / peakSig, 2.))*(erf(peakSkew*(xyTry[0] - peakMu) / peakSig)+1);
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, yMin, yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}